

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O0

void __thiscall sf::Window::setSize(Window *this,Vector2u *size)

{
  Vector2u *size_local;
  Window *this_local;
  
  if (this->m_impl != (WindowImpl *)0x0) {
    (*this->m_impl->_vptr_WindowImpl[6])(this->m_impl,size);
    (this->m_size).x = size->x;
    (this->m_size).y = size->y;
    (*this->_vptr_Window[3])();
  }
  return;
}

Assistant:

void Window::setSize(const Vector2u& size)
{
    if (m_impl)
    {
        m_impl->setSize(size);

        // Cache the new size
        m_size.x = size.x;
        m_size.y = size.y;

        // Notify the derived class
        onResize();
    }
}